

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

void leveldb::_Test_OverlapSequenceChecks::_RunIt(void)

{
  undefined1 local_28 [8];
  _Test_OverlapSequenceChecks t;
  
  _Test_OverlapSequenceChecks((_Test_OverlapSequenceChecks *)local_28);
  _Run((_Test_OverlapSequenceChecks *)local_28);
  ~_Test_OverlapSequenceChecks((_Test_OverlapSequenceChecks *)local_28);
  return;
}

Assistant:

TEST(FindFileTest, OverlapSequenceChecks) {
  Add("200", "200", 5000, 3000);
  ASSERT_TRUE(!Overlaps("199", "199"));
  ASSERT_TRUE(!Overlaps("201", "300"));
  ASSERT_TRUE(Overlaps("200", "200"));
  ASSERT_TRUE(Overlaps("190", "200"));
  ASSERT_TRUE(Overlaps("200", "210"));
}